

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O3

int __thiscall jrtplib::RTPPacket::ParseRawPacket(RTPPacket *this,RTPRawPacket *rawpack)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ushort *puVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  byte bVar11;
  ushort *puVar12;
  size_t sVar13;
  
  iVar6 = -0x19;
  if ((rawpack->isrtp == true) && (uVar4 = rawpack->packetdatalength, 0xb < uVar4)) {
    puVar5 = (ushort *)rawpack->packetdata;
    uVar2 = *puVar5;
    if (((uVar2 & 0xc0) == 0x80) &&
       ((bVar11 = (byte)(uVar2 >> 8), -1 < (short)uVar2 || ((bVar11 & 0x7e) != 0x48)))) {
      if ((uVar2 & 0x20) == 0) {
        uVar8 = 0;
      }
      else {
        bVar1 = *(byte *)((long)puVar5 + (uVar4 - 1));
        uVar8 = (uint)bVar1;
        if (bVar1 == 0) {
          return -0x19;
        }
      }
      uVar10 = uVar2 & 0xf;
      uVar3 = uVar10 * 4;
      lVar7 = (ulong)uVar3 + 0xc;
      bVar9 = SUB41((uVar2 & 0x10) >> 4,0);
      if ((uVar2 & 0x10) == 0) {
        uVar8 = (int)uVar4 - (uVar8 + (int)lVar7);
        if ((int)uVar8 < 0) {
          return -0x19;
        }
        this->hasextension = bVar9;
      }
      else {
        uVar2 = *(ushort *)((long)puVar5 + (ulong)uVar3 + 0xe);
        sVar13 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8) * 4;
        uVar8 = (int)uVar4 - (uVar8 + uVar3 + (int)sVar13 + 0x10);
        if ((int)uVar8 < 0) {
          return -0x19;
        }
        puVar12 = (ushort *)(lVar7 + (long)puVar5);
        lVar7 = (ushort)uVar3 + sVar13 + 0x10;
        this->hasextension = bVar9;
        uVar2 = *puVar12;
        this->extid = uVar2 << 8 | uVar2 >> 8;
        this->extensionlength = sVar13;
        this->extension = (uint8_t *)(puVar12 + 2);
      }
      this->hasmarker = (bool)(bVar11 >> 7);
      this->numcsrcs = uVar10;
      this->payloadtype = bVar11 & 0x7f;
      this->extseqnr = (uint)(ushort)(puVar5[1] << 8 | puVar5[1] >> 8);
      uVar3 = *(uint *)(puVar5 + 2);
      this->timestamp =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar3 = *(uint *)(puVar5 + 4);
      this->ssrc = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      this->packet = (uint8_t *)puVar5;
      this->payload = (uint8_t *)(lVar7 + (long)puVar5);
      this->packetlength = uVar4;
      this->payloadlength = (ulong)(uVar8 & 0x7fffffff);
      rawpack->packetdata = (uint8_t *)0x0;
      rawpack->packetdatalength = 0;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int RTPPacket::ParseRawPacket(RTPRawPacket &rawpack)
{
	uint8_t *packetbytes;
	size_t packetlen;
	uint8_t payloadtype;
	RTPHeader *rtpheader;
	bool marker;
	int csrccount;
	bool hasextension;
	int payloadoffset,payloadlength;
	int numpadbytes;
	RTPExtensionHeader *rtpextheader;
	
	if (!rawpack.IsRTP()) // If we didn't receive it on the RTP port, we'll ignore it
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	// The length should be at least the size of the RTP header
	packetlen = rawpack.GetDataLength();
	if (packetlen < sizeof(RTPHeader))
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	packetbytes = (uint8_t *)rawpack.GetData();
	rtpheader = (RTPHeader *)packetbytes;
	
	// The version number should be correct
	if (rtpheader->version != RTP_VERSION)
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	// We'll check if this is possibly a RTCP packet. For this to be possible
	// the marker bit and payload type combined should be either an SR or RR
	// identifier
	marker = (rtpheader->marker == 0)?false:true;
	payloadtype = rtpheader->payloadtype;
	if (marker)
	{
		if (payloadtype == (RTP_RTCPTYPE_SR & 127)) // don't check high bit (this was the marker!!)
			return ERR_RTP_PACKET_INVALIDPACKET;
		if (payloadtype == (RTP_RTCPTYPE_RR & 127))
			return ERR_RTP_PACKET_INVALIDPACKET;
	}

	csrccount = rtpheader->csrccount;
	payloadoffset = sizeof(RTPHeader)+(int)(csrccount*sizeof(uint32_t));
	
	if (rtpheader->padding) // adjust payload length to take padding into account
	{
		numpadbytes = (int)packetbytes[packetlen-1]; // last byte contains number of padding bytes
		if (numpadbytes <= 0)
			return ERR_RTP_PACKET_INVALIDPACKET;
	}
	else
		numpadbytes = 0;

	hasextension = (rtpheader->extension == 0)?false:true;
	if (hasextension) // got header extension
	{
		rtpextheader = (RTPExtensionHeader *)(packetbytes+payloadoffset);
		payloadoffset += sizeof(RTPExtensionHeader);
		
		uint16_t exthdrlen = ntohs(rtpextheader->length);
		payloadoffset += ((int)exthdrlen)*sizeof(uint32_t);
	}
	else
	{
		rtpextheader = 0;
	}	
	
	payloadlength = packetlen-numpadbytes-payloadoffset;
	if (payloadlength < 0)
		return ERR_RTP_PACKET_INVALIDPACKET;

	// Now, we've got a valid packet, so we can create a new instance of RTPPacket
	// and fill in the members
	
	RTPPacket::hasextension = hasextension;
	if (hasextension)
	{
		RTPPacket::extid = ntohs(rtpextheader->extid);
		RTPPacket::extensionlength = ((int)ntohs(rtpextheader->length))*sizeof(uint32_t);
		RTPPacket::extension = ((uint8_t *)rtpextheader)+sizeof(RTPExtensionHeader);
	}

	RTPPacket::hasmarker = marker;
	RTPPacket::numcsrcs = csrccount;
	RTPPacket::payloadtype = payloadtype;
	
	// Note: we don't fill in the EXTENDED sequence number here, since we
	// don't have information about the source here. We just fill in the low
	// 16 bits
	RTPPacket::extseqnr = (uint32_t)ntohs(rtpheader->sequencenumber);

	RTPPacket::timestamp = ntohl(rtpheader->timestamp);
	RTPPacket::ssrc = ntohl(rtpheader->ssrc);
	RTPPacket::packet = packetbytes;
	RTPPacket::payload = packetbytes+payloadoffset;
	RTPPacket::packetlength = packetlen;
	RTPPacket::payloadlength = payloadlength;

	// We'll zero the data of the raw packet, since we're using it here now!
	rawpack.ZeroData();

	return 0;
}